

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::CoverpointSyntax::getChild(CoverpointSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff68;
  Info *in_stack_ffffffffffffff70;
  nullptr_t in_stack_ffffffffffffff78;
  ConstTokenOrSyntax *in_stack_ffffffffffffff80;
  
  switch(in_RDX) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    break;
  case 1:
    not_null<slang::syntax::DataTypeSyntax_*>::get
              ((not_null<slang::syntax::DataTypeSyntax_*> *)(in_RSI + 0x50));
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    break;
  case 2:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    break;
  case 3:
    token.info = in_stack_ffffffffffffff70;
    token._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x6c5b80,token);
    break;
  case 4:
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RSI + 0x70));
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    break;
  case 5:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    break;
  case 6:
    token_00.info = in_stack_ffffffffffffff70;
    token_00._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x6c5bee,token_00);
    break;
  case 7:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x90),in_stack_ffffffffffffff68);
    break;
  case 8:
    token_01.info = in_stack_ffffffffffffff70;
    token_01._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x6c5c61,token_01);
    break;
  case 9:
    token_02.info = in_stack_ffffffffffffff70;
    token_02._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x6c5c94,token_02);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax CoverpointSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return type.get();
        case 2: return label;
        case 3: return coverpoint;
        case 4: return expr.get();
        case 5: return iff;
        case 6: return openBrace;
        case 7: return &members;
        case 8: return closeBrace;
        case 9: return emptySemi;
        default: return nullptr;
    }
}